

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O3

void __thiscall APlayerPawn::GiveDefaultInventory(APlayerPawn *this)

{
  byte *pbVar1;
  player_t *ppVar2;
  ulong uVar3;
  PClass *pPVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  AInventory *pAVar7;
  DDropItem *pDVar8;
  PClass *pPVar9;
  PClassActor *type;
  AWeapon *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  PClassActor *pPVar10;
  long lVar11;
  bool bVar12;
  AActor *check;
  DVector3 local_48;
  
  if ((this->super_AActor).player != (player_t *)0x0) {
    pPVar9 = (this->super_AActor).super_DThinker.super_DObject.Class;
    if (pPVar9 == (PClass *)0x0) {
      iVar5 = (**(this->super_AActor).super_DThinker.super_DObject._vptr_DObject)(this);
      pPVar9 = (PClass *)CONCAT44(extraout_var,iVar5);
      (this->super_AActor).super_DThinker.super_DObject.Class = pPVar9;
    }
    AActor::GiveInventoryType
              (&this->super_AActor,(PClassActor *)AHexenArmor::RegistrationInfo.MyClass);
    lVar11 = 0;
    pAVar7 = AActor::FindInventory
                       (&this->super_AActor,(PClassActor *)AHexenArmor::RegistrationInfo.MyClass,
                        false);
    *(Node **)&pAVar7[1].super_AActor.super_DThinker.super_DObject.ObjectFlags =
         pPVar9[2].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
         super_PType.Symbols.Symbols.LastFree;
    do {
      (&pAVar7[1].super_AActor.super_DThinker.NextThinker)[lVar11] =
           *(DThinker **)
            (&pPVar9[2].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
              super_PType.Symbols.Symbols.Size + lVar11 * 2);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    local_48.Z = 0.0;
    local_48.X = 0.0;
    local_48.Y = 0.0;
    pAVar7 = (AInventory *)
             AActor::StaticSpawn((PClassActor *)ABasicArmor::RegistrationInfo.MyClass,&local_48,
                                 NO_REPLACE,false);
    AInventory::BecomeItem(pAVar7);
    pAVar7[1].super_AActor.super_DThinker.super_DObject._vptr_DObject = (_func_int **)0x0;
    pAVar7->Amount = 0;
    (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x14])(this,pAVar7);
    for (pDVar8 = AActor::GetDropItems(&this->super_AActor); pDVar8 != (DDropItem *)0x0;
        pDVar8 = pDVar8->Next) {
      uVar3 = (ulong)local_48.X >> 0x20;
      local_48.X = (double)CONCAT44((int)uVar3,(pDVar8->Name).Index);
      pPVar9 = PClass::FindClass((FName *)&local_48);
      type = dyn_cast<PClassActor>((DObject *)pPVar9);
      if (type != (PClassActor *)0x0) {
        pPVar10 = type;
        if (type != (PClassActor *)AInventory::RegistrationInfo.MyClass) {
          do {
            pPVar10 = (PClassActor *)(pPVar10->super_PClass).ParentClass;
            if (pPVar10 == (PClassActor *)AInventory::RegistrationInfo.MyClass) break;
          } while (pPVar10 != (PClassActor *)0x0);
          if (pPVar10 == (PClassActor *)0x0) {
            Printf("\x1cI%s is not an inventory item and cannot be given to a player as start item.\n"
                   ,FName::NameData.NameArray
                    [(type->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                     TypeName.Index].Text);
            goto LAB_0046835c;
          }
        }
        this_00 = (AWeapon *)AActor::FindInventory(&this->super_AActor,type,false);
        if (this_00 == (AWeapon *)0x0) {
          local_48.X = 0.0;
          local_48.Y = 0.0;
          local_48.Z = 0.0;
          this_00 = (AWeapon *)AActor::StaticSpawn(type,&local_48,NO_REPLACE,false);
          pbVar1 = (byte *)((long)&(this_00->super_AStateProvider).super_AInventory.ItemFlags + 1);
          *pbVar1 = *pbVar1 | 0x40;
          (this_00->super_AStateProvider).super_AInventory.Amount = pDVar8->Amount;
          pPVar4 = AWeapon::RegistrationInfo.MyClass;
          pPVar9 = (this_00->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                   super_DObject.Class;
          if (pPVar9 == (PClass *)0x0) {
            iVar5 = (**(this_00->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                       super_DObject._vptr_DObject)(this_00);
            pPVar9 = (PClass *)CONCAT44(extraout_var_01,iVar5);
            (this_00->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
            super_DObject.Class = pPVar9;
          }
          bVar12 = pPVar9 != (PClass *)0x0;
          if (pPVar9 != pPVar4 && bVar12) {
            do {
              pPVar9 = pPVar9->ParentClass;
              bVar12 = pPVar9 != (PClass *)0x0;
              if (pPVar9 == pPVar4) break;
            } while (pPVar9 != (PClass *)0x0);
          }
          if (bVar12) {
            this_00->AmmoGive1 = 0;
            this_00->AmmoGive2 = 0;
          }
          bVar12 = AInventory::CallTryPickup
                             ((AInventory *)this_00,&this->super_AActor,(AActor **)&local_48);
          if (!bVar12) {
            if ((APlayerPawn *)local_48.X != this) {
              I_Error("Cannot give morph items when starting a game");
            }
            (*(this_00->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
              super_DObject._vptr_DObject[4])(this_00);
            goto LAB_0046835c;
          }
        }
        else {
          iVar5 = (this_00->super_AStateProvider).super_AInventory.Amount;
          iVar6 = pDVar8->Amount;
          if (iVar6 == 0) {
            pPVar9 = (this_00->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                     super_DObject.Class;
            if (pPVar9 == (PClass *)0x0) {
              iVar6 = (**(this_00->super_AStateProvider).super_AInventory.super_AActor.
                         super_DThinker.super_DObject._vptr_DObject)(this_00);
              pPVar9 = (PClass *)CONCAT44(extraout_var_00,iVar6);
              (this_00->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
              super_DObject.Class = pPVar9;
            }
            iVar6 = *(int *)(pPVar9->Defaults + 0x4c8);
          }
          iVar6 = iVar6 + iVar5;
          iVar5 = (this_00->super_AStateProvider).super_AInventory.MaxAmount;
          if (iVar6 < iVar5) {
            iVar5 = iVar6;
          }
          if (iVar6 < 1) {
            iVar5 = 0;
          }
          (this_00->super_AStateProvider).super_AInventory.Amount = iVar5;
        }
        pPVar4 = AWeapon::RegistrationInfo.MyClass;
        pPVar9 = (this_00->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                 super_DObject.Class;
        if (pPVar9 == (PClass *)0x0) {
          iVar5 = (**(this_00->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                     super_DObject._vptr_DObject)(this_00);
          pPVar9 = (PClass *)CONCAT44(extraout_var_02,iVar5);
          (this_00->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.super_DObject
          .Class = pPVar9;
        }
        bVar12 = pPVar9 != (PClass *)0x0;
        if (pPVar9 != pPVar4 && bVar12) {
          do {
            pPVar9 = pPVar9->ParentClass;
            bVar12 = pPVar9 != (PClass *)0x0;
            if (pPVar9 == pPVar4) break;
          } while (pPVar9 != (PClass *)0x0);
        }
        if ((bVar12) && (bVar12 = AWeapon::CheckAmmo(this_00,2,false,false,-1), bVar12)) {
          ppVar2 = (this->super_AActor).player;
          ppVar2->PendingWeapon = this_00;
          ppVar2->ReadyWeapon = this_00;
        }
      }
LAB_0046835c:
    }
  }
  return;
}

Assistant:

void APlayerPawn::GiveDefaultInventory ()
{
	if (player == NULL) return;

	// HexenArmor must always be the first item in the inventory because
	// it provides player class based protection that should not affect
	// any other protection item.
	PClassPlayerPawn *myclass = GetClass();
	GiveInventoryType(RUNTIME_CLASS(AHexenArmor));
	AHexenArmor *harmor = FindInventory<AHexenArmor>();
	harmor->Slots[4] = myclass->HexenArmor[0];
	for (int i = 0; i < 4; ++i)
	{
		harmor->SlotsIncrement[i] = myclass->HexenArmor[i + 1];
	}

	// BasicArmor must come right after that. It should not affect any
	// other protection item as well but needs to process the damage
	// before the HexenArmor does.
	ABasicArmor *barmor = Spawn<ABasicArmor> ();
	barmor->BecomeItem ();
	barmor->SavePercent = 0;
	barmor->Amount = 0;
	AddInventory (barmor);

	// Now add the items from the DECORATE definition
	DDropItem *di = GetDropItems();

	while (di)
	{
		PClassActor *ti = PClass::FindActor (di->Name);
		if (ti)
		{
			if (!ti->IsDescendantOf(RUNTIME_CLASS(AInventory)))
			{
				Printf(TEXTCOLOR_ORANGE "%s is not an inventory item and cannot be given to a player as start item.\n", ti->TypeName.GetChars());
			}
			else
			{
				AInventory *item = FindInventory(ti);
				if (item != NULL)
				{
					item->Amount = clamp<int>(
						item->Amount + (di->Amount ? di->Amount : ((AInventory *)item->GetDefault())->Amount),
						0, item->MaxAmount);
				}
				else
				{
					item = static_cast<AInventory *>(Spawn(ti));
					item->ItemFlags |= IF_IGNORESKILL;	// no skill multiplicators here
					item->Amount = di->Amount;
					if (item->IsKindOf(RUNTIME_CLASS(AWeapon)))
					{
						// To allow better control any weapon is emptied of
						// ammo before being given to the player.
						static_cast<AWeapon*>(item)->AmmoGive1 =
							static_cast<AWeapon*>(item)->AmmoGive2 = 0;
					}
					AActor *check;
					if (!item->CallTryPickup(this, &check))
					{
						if (check != this)
						{
							// Player was morphed. This is illegal at game start.
							// This problem is only detectable when it's too late to do something about it...
							I_Error("Cannot give morph items when starting a game");
						}
						item->Destroy();
						item = NULL;
					}
				}
				if (item != NULL && item->IsKindOf(RUNTIME_CLASS(AWeapon)) &&
					static_cast<AWeapon*>(item)->CheckAmmo(AWeapon::EitherFire, false))
				{
					player->ReadyWeapon = player->PendingWeapon = static_cast<AWeapon *> (item);
				}
			}
		}
		di = di->Next;
	}
}